

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O1

void aes_sw_setiv_sdctr(ssh_cipher *ciph,void *viv)

{
  ulong uVar1;
  long lVar2;
  uint8_t *iv;
  long lVar3;
  
  lVar3 = (long)viv + 0xf;
  lVar2 = 0;
  do {
    uVar1 = *(ulong *)(lVar3 + -7);
    ciph[lVar2 + -0xb].vt =
         (ssh_cipheralg *)
         (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + -8;
  } while (lVar2 == 1);
  ciph[-1].vt = (ssh_cipheralg *)(ciph + -1);
  return;
}

Assistant:

static void aes_sw_setiv_sdctr(ssh_cipher *ciph, const void *viv)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    const uint8_t *iv = (const uint8_t *)viv;

    /* Import the initial counter value into the internal representation */
    for (unsigned i = 0; i < SDCTR_WORDS; i++)
        ctx->iv.sdctr.counter[i] =
            GET_BIGNUMINT_MSB_FIRST(
                iv + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES);

    /* Set keystream_pos to indicate that the keystream cache is
     * currently empty */
    ctx->iv.sdctr.keystream_pos =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);
}